

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O1

void av1_lowbd_inv_txfm2d_add_ssse3
               (int32_t *input,uint8_t *output,int stride,TX_TYPE tx_type,TX_SIZE tx_size,int eob)

{
  ulong uVar1;
  char cVar2;
  transform_1d_ssse3 p_Var3;
  transform_1d_ssse3 p_Var4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  int iVar13;
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  longlong lVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [12];
  undefined1 auVar45 [16];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [15];
  undefined1 auVar51 [12];
  undefined1 auVar52 [12];
  undefined1 auVar53 [12];
  undefined1 auVar54 [12];
  undefined1 auVar55 [12];
  undefined1 auVar56 [12];
  undefined1 auVar57 [12];
  undefined1 auVar58 [12];
  undefined1 auVar59 [12];
  undefined1 auVar60 [12];
  undefined1 auVar61 [12];
  undefined1 auVar62 [12];
  undefined1 auVar63 [12];
  undefined1 auVar64 [12];
  undefined1 auVar65 [12];
  undefined1 auVar66 [12];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  undefined1 auVar70 [15];
  undefined1 auVar71 [15];
  undefined1 auVar72 [15];
  undefined1 auVar73 [15];
  undefined1 auVar74 [15];
  int8_t *piVar75;
  int8_t *piVar76;
  int8_t *piVar77;
  int8_t *piVar78;
  uint uVar79;
  long lVar80;
  long lVar81;
  long lVar82;
  longlong *plVar83;
  longlong *plVar84;
  undefined1 (*pauVar85) [16];
  byte bVar86;
  undefined7 in_register_00000081;
  ulong *puVar87;
  int32_t *piVar88;
  __m128i *palVar89;
  bool bVar90;
  undefined4 uVar91;
  undefined1 auVar93 [12];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  __m128i alVar102;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar126 [16];
  undefined1 auVar130 [16];
  undefined1 auVar134 [16];
  undefined1 auVar137 [16];
  undefined2 uVar138;
  undefined2 uVar180;
  undefined2 uVar181;
  undefined2 uVar182;
  undefined2 uVar183;
  undefined2 uVar184;
  undefined2 uVar185;
  undefined1 auVar139 [16];
  undefined1 auVar143 [16];
  undefined1 auVar147 [16];
  undefined2 uVar186;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar167 [16];
  undefined1 auVar170 [16];
  undefined1 auVar174 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined4 uVar187;
  undefined1 auVar189 [12];
  undefined1 auVar191 [16];
  undefined1 auVar196 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar204 [16];
  undefined1 auVar208 [16];
  undefined1 auVar211 [16];
  undefined2 uVar215;
  undefined2 uVar239;
  undefined2 uVar240;
  undefined2 uVar241;
  undefined2 uVar242;
  undefined2 uVar243;
  undefined2 uVar244;
  undefined2 uVar245;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar230 [16];
  undefined1 auVar233 [16];
  undefined1 auVar236 [16];
  undefined1 auVar246 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar270 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  __m128i buf [8];
  longlong local_258 [2];
  undefined8 local_248;
  undefined8 uStack_240;
  undefined1 local_238 [4];
  undefined4 uStack_234;
  undefined4 uStack_230;
  undefined4 uStack_22c;
  undefined1 local_228 [16];
  undefined4 local_218;
  undefined4 uStack_214;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 auStack_200 [3];
  undefined1 local_1e8 [16];
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined4 local_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined2 local_1a8;
  undefined2 uStack_1a6;
  undefined2 uStack_1a4;
  undefined2 uStack_1a2;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  undefined4 local_198;
  undefined4 uStack_194;
  undefined8 uStack_190;
  undefined2 local_188;
  undefined2 uStack_186;
  undefined2 uStack_184;
  undefined2 uStack_182;
  undefined1 local_178 [12];
  undefined2 local_168;
  undefined2 uStack_166;
  undefined2 uStack_164;
  undefined2 uStack_162;
  uint local_14c;
  char *local_148;
  transform_1d_ssse3 local_140;
  __m128i local_138;
  undefined2 local_128;
  undefined2 uStack_126;
  undefined2 uStack_124;
  undefined2 uStack_122;
  undefined2 uStack_120;
  undefined2 uStack_11e;
  undefined2 uStack_11c;
  undefined2 uStack_11a;
  undefined1 local_118 [16];
  undefined2 local_108;
  undefined2 uStack_106;
  undefined2 uStack_104;
  undefined2 uStack_102;
  undefined2 uStack_100;
  undefined2 uStack_fe;
  undefined2 uStack_fc;
  undefined2 uStack_fa;
  undefined1 local_f8 [16];
  undefined2 local_e8;
  undefined2 uStack_e6;
  undefined2 uStack_e4;
  undefined2 uStack_e2;
  undefined1 local_d8 [16];
  undefined2 local_c8;
  undefined2 uStack_c6;
  undefined2 uStack_c4;
  undefined2 uStack_c2;
  undefined1 local_b8 [16];
  undefined2 local_a8;
  undefined2 uStack_a6;
  undefined2 uStack_a4;
  undefined2 uStack_a2;
  undefined1 local_98 [16];
  undefined2 local_88;
  undefined2 uStack_86;
  undefined2 uStack_84;
  undefined2 uStack_82;
  undefined1 local_78 [16];
  undefined2 local_68;
  undefined2 uStack_66;
  undefined2 uStack_64;
  undefined2 uStack_62;
  undefined1 local_58 [16];
  undefined2 local_48;
  undefined2 uStack_46;
  undefined2 uStack_44;
  undefined2 uStack_42;
  undefined1 auVar92 [12];
  undefined1 auVar106 [16];
  undefined1 auVar123 [16];
  undefined1 auVar127 [16];
  undefined1 auVar131 [16];
  undefined1 auVar96 [16];
  undefined1 auVar107 [16];
  undefined1 auVar112 [16];
  undefined1 auVar124 [16];
  undefined1 auVar128 [16];
  undefined1 auVar132 [16];
  undefined1 auVar135 [16];
  undefined1 auVar97 [16];
  undefined1 auVar103 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar113 [16];
  undefined1 auVar119 [16];
  undefined1 auVar125 [16];
  undefined1 auVar129 [16];
  undefined1 auVar133 [16];
  undefined1 auVar136 [16];
  undefined1 auVar140 [16];
  undefined1 auVar144 [16];
  undefined1 auVar150 [16];
  undefined1 auVar171 [16];
  undefined1 auVar175 [16];
  undefined1 auVar141 [16];
  undefined1 auVar145 [16];
  undefined1 auVar151 [16];
  undefined1 auVar155 [16];
  undefined1 auVar161 [16];
  undefined1 auVar165 [16];
  undefined1 auVar168 [16];
  undefined1 auVar172 [16];
  undefined1 auVar176 [16];
  undefined1 auVar142 [16];
  undefined1 auVar146 [16];
  undefined1 auVar152 [16];
  undefined1 auVar156 [16];
  undefined1 auVar162 [16];
  undefined1 auVar166 [16];
  undefined1 auVar169 [16];
  undefined1 auVar173 [16];
  undefined1 auVar177 [16];
  undefined1 auVar188 [12];
  undefined1 auVar192 [16];
  undefined1 auVar201 [16];
  undefined1 auVar205 [16];
  undefined1 auVar212 [16];
  undefined1 auVar193 [16];
  undefined1 auVar197 [16];
  undefined1 auVar202 [16];
  undefined1 auVar206 [16];
  undefined1 auVar209 [16];
  undefined1 auVar213 [16];
  undefined1 auVar190 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar198 [16];
  undefined1 auVar203 [16];
  undefined1 auVar207 [16];
  undefined1 auVar210 [16];
  undefined1 auVar214 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar223 [16];
  undefined1 auVar228 [16];
  undefined1 auVar231 [16];
  undefined1 auVar234 [16];
  undefined1 auVar237 [16];
  undefined1 auVar220 [16];
  undefined1 auVar224 [16];
  undefined1 auVar229 [16];
  undefined1 auVar232 [16];
  undefined1 auVar235 [16];
  undefined1 auVar238 [16];
  undefined1 auVar247 [16];
  undefined1 auVar252 [16];
  undefined1 auVar259 [16];
  undefined1 auVar258 [16];
  undefined1 auVar248 [16];
  undefined1 auVar253 [16];
  undefined1 auVar260 [16];
  undefined1 auVar249 [16];
  undefined1 auVar254 [16];
  undefined1 auVar261 [16];
  undefined1 auVar268 [16];
  undefined1 auVar271 [16];
  undefined1 auVar269 [16];
  undefined1 auVar272 [16];
  
  piVar78 = av1_inv_txfm_shift_ls[0xe];
  piVar77 = av1_inv_txfm_shift_ls[6];
  piVar76 = av1_inv_txfm_shift_ls[5];
  piVar75 = av1_inv_txfm_shift_ls[0];
  iVar13 = (int)CONCAT71(in_register_00000081,tx_size);
  switch(iVar13) {
  case 5:
    p_Var3 = lowbd_txfm_all_1d_w8_arr[0][""[tx_type]];
    bVar90 = 0xf < tx_type;
    uVar79 = 0xbeaf >> (tx_type & 0x1f);
    p_Var4 = lowbd_txfm_all_1d_w4_arr[1][""[tx_type]];
    lVar82 = 0;
    do {
      auVar94 = packssdw(*(undefined1 (*) [16])((long)input + lVar82 * 2),
                         *(undefined1 (*) [16])((long)input + lVar82 * 2 + 0x10));
      *(undefined1 (*) [16])((long)local_258 + lVar82) = auVar94;
      lVar82 = lVar82 + 0x10;
    } while (lVar82 != 0x40);
    lVar82 = 0;
    do {
      auVar94 = pmulhrsw(*(undefined1 (*) [16])((long)local_258 + lVar82),_DAT_005689f0);
      *(undefined1 (*) [16])((long)local_258 + lVar82) = auVar94;
      lVar82 = lVar82 + 0x10;
    } while (lVar82 != 0x40);
    palVar89 = &local_258;
    (*p_Var3)(palVar89,palVar89);
    if ((0x7f1fU >> (tx_type & 0x1f) & 1) == 0 && !bVar90) {
      lVar82 = 0x40;
      do {
        lVar35 = (*palVar89)[1];
        *(longlong *)((long)&local_148 + lVar82) = (*palVar89)[0];
        *(longlong *)((long)local_138 + lVar82 + -8) = lVar35;
        palVar89 = palVar89 + 1;
        lVar82 = lVar82 + -0x10;
        _local_238 = local_118;
        local_248._0_2_ = local_128;
        local_248._2_2_ = uStack_126;
        local_248._4_2_ = uStack_124;
        local_248._6_2_ = uStack_122;
        uStack_240._0_2_ = uStack_120;
        uStack_240._2_2_ = uStack_11e;
        uStack_240._4_2_ = uStack_11c;
        uStack_240._6_2_ = uStack_11a;
        local_228._0_2_ = local_108;
        local_228._2_2_ = uStack_106;
        local_228._4_2_ = uStack_104;
        local_228._6_2_ = uStack_102;
        local_228._8_2_ = uStack_100;
        local_228._10_2_ = uStack_fe;
        local_228._12_2_ = uStack_fc;
        local_228._14_2_ = uStack_fa;
      } while (lVar82 != 0);
    }
    else {
      local_138[1] = local_258[1];
      local_138[0] = local_258[0];
    }
    auVar254._0_12_ = local_138._0_12_;
    auVar254._12_2_ = local_138[0]._6_2_;
    auVar254._14_2_ = local_248._6_2_;
    auVar253._12_4_ = auVar254._12_4_;
    auVar253._0_10_ = local_138._0_10_;
    auVar253._10_2_ = local_248._4_2_;
    auVar252._10_6_ = auVar253._10_6_;
    auVar252._0_8_ = local_138[0];
    auVar252._8_2_ = local_138[0]._4_2_;
    auVar48._4_8_ = auVar252._8_8_;
    auVar48._2_2_ = local_248._2_2_;
    auVar48._0_2_ = local_138[0]._2_2_;
    auVar251._0_4_ = CONCAT22((undefined2)local_248,(short)local_138[0]);
    auVar251._4_12_ = auVar48;
    auVar272._0_12_ = local_238._0_12_;
    auVar272._12_2_ = local_238._6_2_;
    auVar272._14_2_ = local_228._6_2_;
    auVar271._12_4_ = auVar272._12_4_;
    auVar271._0_10_ = local_238._0_10_;
    auVar271._10_2_ = local_228._4_2_;
    auVar270._10_6_ = auVar271._10_6_;
    auVar270._0_8_ = local_238._0_8_;
    auVar270._8_2_ = local_238._4_2_;
    auVar49._4_8_ = auVar270._8_8_;
    auVar49._2_2_ = local_228._2_2_;
    auVar49._0_2_ = local_238._2_2_;
    local_218 = CONCAT22((undefined2)uStack_240,(short)local_138[1]);
    auVar93._0_8_ = CONCAT26(uStack_240._2_2_,CONCAT24(local_138[1]._2_2_,local_218));
    auVar93._8_2_ = local_138[1]._4_2_;
    auVar93._10_2_ = uStack_240._4_2_;
    auVar109._12_2_ = local_138[1]._6_2_;
    auVar109._0_12_ = auVar93;
    auVar109._14_2_ = uStack_240._6_2_;
    uStack_214 = CONCAT22(local_228._8_2_,local_238._8_2_);
    auVar189._0_8_ = CONCAT26(local_228._10_2_,CONCAT24(local_238._10_2_,uStack_214));
    auVar189._8_2_ = local_238._12_2_;
    auVar189._10_2_ = local_228._12_2_;
    auVar195._12_2_ = local_238._14_2_;
    auVar195._0_12_ = auVar189;
    auVar195._14_2_ = local_228._14_2_;
    auVar153._0_8_ = auVar251._0_8_;
    auVar153._8_4_ = auVar48._0_4_;
    auVar153._12_4_ = auVar49._0_4_;
    local_248 = auVar153._8_8_;
    local_258[0] = CONCAT44(CONCAT22(local_228._0_2_,local_238._0_2_),auVar251._0_4_);
    auVar221._8_4_ = (int)((ulong)auVar93._0_8_ >> 0x20);
    auVar221._0_8_ = auVar93._0_8_;
    auVar221._12_4_ = (int)((ulong)auVar189._0_8_ >> 0x20);
    local_208 = auVar221._8_8_;
    auVar255._0_8_ = CONCAT44(auVar270._8_4_,auVar252._8_4_);
    auVar255._8_4_ = auVar253._12_4_;
    auVar255._12_4_ = auVar271._12_4_;
    auVar110._0_8_ = CONCAT44(auVar189._8_4_,auVar93._8_4_);
    auVar110._8_4_ = auVar109._12_4_;
    auVar110._12_4_ = auVar195._12_4_;
    local_258[1] = 0;
    uStack_240 = 0;
    _uStack_230 = 0;
    _local_238 = auVar255._0_8_;
    local_228 = auVar255 >> 0x40;
    uStack_210 = 0;
    auStack_200[0] = 0;
    auStack_200[2] = 0;
    local_1e8 = auVar110 >> 0x40;
    auStack_200[1] = auVar110._0_8_;
    (*p_Var4)(&local_258,&local_258);
    cVar2 = piVar76[1];
    if (cVar2 < '\0') {
      auVar94 = ZEXT416((uint)(1 << (cVar2 + 0xfU & 0x1f)));
      auVar94 = pshuflw(auVar94,auVar94,0);
      auVar116._0_4_ = auVar94._0_4_;
      auVar116._4_4_ = auVar116._0_4_;
      auVar116._8_4_ = auVar116._0_4_;
      auVar116._12_4_ = auVar116._0_4_;
      lVar82 = 0;
      do {
        auVar94 = pmulhrsw(*(undefined1 (*) [16])((long)local_258 + lVar82),auVar116);
        *(undefined1 (*) [16])((long)local_258 + lVar82) = auVar94;
        lVar82 = lVar82 + 0x10;
      } while (lVar82 != 0x80);
    }
    else if (cVar2 != '\0') {
      lVar82 = 0;
      do {
        auVar94 = psllw(*(undefined1 (*) [16])((long)local_258 + lVar82),ZEXT416((uint)(int)cVar2));
        *(undefined1 (*) [16])((long)local_258 + lVar82) = auVar94;
        lVar82 = lVar82 + 0x10;
      } while (lVar82 != 0x80);
    }
    lVar82 = 0x70;
    if ((uVar79 & 1) != 0 || bVar90) {
      lVar82 = 0;
    }
    pauVar85 = (undefined1 (*) [16])((long)local_258 + lVar82);
    lVar82 = 8;
    do {
      uVar91 = *(undefined4 *)output;
      auVar158._8_8_ = 0;
      auVar158._0_8_ =
           (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((
                                                  uint)uVar91 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)uVar91 >> 0x10),uVar91)) >>
                                                  0x20),uVar91) >> 0x18),
                                           CONCAT12((char)((uint)uVar91 >> 8),(short)uVar91)) >>
                                 0x10),(short)uVar91) & 0xffff00ff00ff00ff;
      auVar94 = paddsw(auVar158,*pauVar85);
      sVar5 = auVar94._0_2_;
      sVar6 = auVar94._2_2_;
      sVar7 = auVar94._4_2_;
      sVar8 = auVar94._6_2_;
      *(uint *)output =
           CONCAT13((0 < sVar8) * (sVar8 < 0x100) * auVar94[6] - (0xff < sVar8),
                    CONCAT12((0 < sVar7) * (sVar7 < 0x100) * auVar94[4] - (0xff < sVar7),
                             CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar94[2] - (0xff < sVar6),
                                      (0 < sVar5) * (sVar5 < 0x100) * auVar94[0] - (0xff < sVar5))))
      ;
      output = output + stride;
      pauVar85 = (undefined1 (*) [16])(pauVar85[-1] + (((byte)((byte)uVar79 | bVar90) & 1) << 5));
      lVar82 = lVar82 + -1;
    } while (lVar82 != 0);
    break;
  case 6:
    p_Var3 = lowbd_txfm_all_1d_w4_arr[1][""[tx_type]];
    p_Var4 = lowbd_txfm_all_1d_w8_arr[0][""[tx_type]];
    bVar86 = (byte)(0xbeaf >> (tx_type & 0x1f)) | 0xf < tx_type;
    lVar82 = 0;
    do {
      auVar94 = packssdw(*(undefined1 (*) [16])((long)input + lVar82),
                         *(undefined1 (*) [16])((long)input + lVar82));
      *(undefined1 (*) [16])((long)local_258 + lVar82) = auVar94;
      lVar82 = lVar82 + 0x10;
    } while (lVar82 != 0x80);
    lVar82 = 0;
    do {
      auVar94 = pmulhrsw(*(undefined1 (*) [16])((long)local_258 + lVar82),_DAT_005689f0);
      *(undefined1 (*) [16])((long)local_258 + lVar82) = auVar94;
      lVar82 = lVar82 + 0x10;
    } while (lVar82 != 0x80);
    palVar89 = &local_258;
    _local_238 = stack0xfffffffffffffdca;
    (*p_Var3)(palVar89,palVar89);
    if ((0x7f1fU >> (tx_type & 0x1f) & 1) == 0 && 0xf >= tx_type) {
      lVar82 = 0x80;
      do {
        lVar35 = (*palVar89)[1];
        *(longlong *)((long)&local_148 + lVar82) = (*palVar89)[0];
        *(longlong *)((long)local_138 + lVar82 + -8) = lVar35;
        palVar89 = palVar89 + 1;
        lVar82 = lVar82 + -0x10;
      } while (lVar82 != 0);
      auVar113._0_12_ = local_138._0_12_;
      auVar113._12_2_ = local_138[0]._6_2_;
      auVar113._14_2_ = uStack_122;
      auVar112._12_4_ = auVar113._12_4_;
      auVar112._0_10_ = local_138._0_10_;
      auVar112._10_2_ = uStack_124;
      auVar111._10_6_ = auVar112._10_6_;
      auVar111._0_8_ = local_138[0];
      auVar111._8_2_ = local_138[0]._4_2_;
      auVar105._8_8_ = auVar111._8_8_;
      auVar105._6_2_ = uStack_126;
      auVar105._4_2_ = local_138[0]._2_2_;
      auVar105._0_2_ = (undefined2)local_138[0];
      auVar105._2_2_ = local_128;
      auVar156._0_12_ = local_118._0_12_;
      auVar156._12_2_ = local_118._6_2_;
      auVar156._14_2_ = uStack_102;
      auVar155._12_4_ = auVar156._12_4_;
      auVar155._0_10_ = local_118._0_10_;
      auVar155._10_2_ = uStack_104;
      auVar154._10_6_ = auVar155._10_6_;
      auVar154._0_8_ = local_118._0_8_;
      auVar154._8_2_ = local_118._4_2_;
      auVar149._8_8_ = auVar154._8_8_;
      auVar149._6_2_ = uStack_106;
      auVar149._4_2_ = local_118._2_2_;
      auVar149._0_2_ = local_118._0_2_;
      auVar149._2_2_ = local_108;
      auVar198._0_12_ = local_f8._0_12_;
      auVar198._12_2_ = local_f8._6_2_;
      auVar198._14_2_ = uStack_e2;
      auVar197._12_4_ = auVar198._12_4_;
      auVar197._0_10_ = local_f8._0_10_;
      auVar197._10_2_ = uStack_e4;
      auVar196._10_6_ = auVar197._10_6_;
      auVar196._0_8_ = local_f8._0_8_;
      auVar196._8_2_ = local_f8._4_2_;
      auVar191._8_8_ = auVar196._8_8_;
      auVar191._6_2_ = uStack_e6;
      auVar191._4_2_ = local_f8._2_2_;
      auVar191._0_2_ = local_f8._0_2_;
      auVar191._2_2_ = local_e8;
      auVar224._0_12_ = local_d8._0_12_;
      auVar224._12_2_ = local_d8._6_2_;
      auVar224._14_2_ = uStack_c2;
      auVar223._12_4_ = auVar224._12_4_;
      auVar223._0_10_ = local_d8._0_10_;
      auVar223._10_2_ = uStack_c4;
      auVar222._10_6_ = auVar223._10_6_;
      auVar222._0_8_ = local_d8._0_8_;
      auVar222._8_2_ = local_d8._4_2_;
      auVar217._8_8_ = auVar222._8_8_;
      auVar217._6_2_ = uStack_c6;
      auVar217._4_2_ = local_d8._2_2_;
      auVar217._0_2_ = local_d8._0_2_;
      auVar217._2_2_ = local_c8;
    }
    else {
      auVar37._8_8_ = local_258[1];
      auVar37._0_8_ = local_258[0];
      auVar39._8_8_ = uStack_210;
      auVar39._0_8_ = CONCAT44(uStack_214,local_218);
      auVar41._8_8_ = auStack_200[2];
      auVar41._0_8_ = auStack_200[1];
      auVar108._0_12_ = auVar37._0_12_;
      auVar108._12_2_ = (short)((ulong)local_258[0] >> 0x30);
      auVar108._14_2_ = local_248._6_2_;
      auVar107._12_4_ = auVar108._12_4_;
      auVar107._0_10_ = auVar37._0_10_;
      auVar107._10_2_ = local_248._4_2_;
      auVar106._10_6_ = auVar107._10_6_;
      auVar106._8_2_ = (short)((ulong)local_258[0] >> 0x20);
      auVar106._0_8_ = local_258[0];
      auVar105._8_8_ = auVar106._8_8_;
      auVar105._6_2_ = local_248._2_2_;
      auVar105._4_2_ = (short)((ulong)local_258[0] >> 0x10);
      auVar105._0_2_ = (undefined2)local_258[0];
      auVar105._2_2_ = (undefined2)local_248;
      auVar152._12_2_ = local_238._6_2_;
      auVar152._0_12_ = _local_238;
      auVar152._14_2_ = local_228._6_2_;
      auVar151._12_4_ = auVar152._12_4_;
      auVar151._0_10_ = local_238._0_10_;
      auVar151._10_2_ = local_228._4_2_;
      auVar150._10_6_ = auVar151._10_6_;
      auVar150._0_8_ = local_238._0_8_;
      auVar150._8_2_ = local_238._4_2_;
      auVar149._8_8_ = auVar150._8_8_;
      auVar149._6_2_ = local_228._2_2_;
      auVar149._4_2_ = local_238._2_2_;
      auVar149._0_2_ = local_238._0_2_;
      auVar149._2_2_ = local_228._0_2_;
      auVar194._0_12_ = auVar39._0_12_;
      auVar194._12_2_ = (short)((uint)uStack_214 >> 0x10);
      auVar194._14_2_ = local_208._6_2_;
      auVar193._12_4_ = auVar194._12_4_;
      auVar193._0_10_ = auVar39._0_10_;
      auVar193._10_2_ = local_208._4_2_;
      auVar192._10_6_ = auVar193._10_6_;
      auVar192._8_2_ = (short)uStack_214;
      auVar192._0_8_ = CONCAT44(uStack_214,local_218);
      auVar191._8_8_ = auVar192._8_8_;
      auVar191._6_2_ = local_208._2_2_;
      auVar191._4_2_ = (short)((uint)local_218 >> 0x10);
      auVar191._0_2_ = (undefined2)local_218;
      auVar191._2_2_ = (undefined2)local_208;
      auVar220._0_12_ = auVar41._0_12_;
      auVar220._12_2_ = (short)((ulong)auStack_200[1] >> 0x30);
      auVar220._14_2_ = local_1e8._6_2_;
      auVar219._12_4_ = auVar220._12_4_;
      auVar219._0_10_ = auVar41._0_10_;
      auVar219._10_2_ = local_1e8._4_2_;
      auVar218._10_6_ = auVar219._10_6_;
      auVar218._8_2_ = (short)((ulong)auStack_200[1] >> 0x20);
      auVar218._0_8_ = auStack_200[1];
      auVar217._8_8_ = auVar218._8_8_;
      auVar217._6_2_ = local_1e8._2_2_;
      auVar217._4_2_ = (short)((ulong)auStack_200[1] >> 0x10);
      auVar217._0_2_ = (undefined2)auStack_200[1];
      auVar217._2_2_ = local_1e8._0_2_;
    }
    auVar256._0_8_ = auVar105._0_8_;
    auVar256._8_4_ = auVar105._4_4_;
    auVar256._12_4_ = auVar149._4_4_;
    local_248 = auVar256._8_8_;
    local_258[0] = CONCAT44(auVar149._0_4_,auVar105._0_4_);
    auVar273._0_8_ = auVar191._0_8_;
    auVar273._8_4_ = auVar191._4_4_;
    auVar273._12_4_ = auVar217._4_4_;
    uStack_240 = auVar273._8_8_;
    local_258[1] = CONCAT44(auVar217._0_4_,auVar191._0_4_);
    auVar114._0_8_ = CONCAT44(auVar149._8_4_,auVar105._8_4_);
    auVar114._8_4_ = auVar105._12_4_;
    auVar114._12_4_ = auVar149._12_4_;
    local_218 = auVar191._12_4_;
    uStack_214 = auVar217._12_4_;
    uStack_230 = auVar191._8_4_;
    _local_238 = auVar114._0_8_;
    uStack_22c = auVar217._8_4_;
    local_228._0_8_ = auVar114._8_8_;
    (*p_Var4)(&local_258,&local_258);
    cVar2 = piVar77[1];
    if (cVar2 < '\0') {
      auVar94 = ZEXT416((uint)(1 << (cVar2 + 0xfU & 0x1f)));
      auVar94 = pshuflw(auVar94,auVar94,0);
      auVar117._0_4_ = auVar94._0_4_;
      auVar117._4_4_ = auVar117._0_4_;
      auVar117._8_4_ = auVar117._0_4_;
      auVar117._12_4_ = auVar117._0_4_;
      lVar82 = 0;
      do {
        auVar94 = pmulhrsw(*(undefined1 (*) [16])((long)local_258 + lVar82),auVar117);
        *(undefined1 (*) [16])((long)local_258 + lVar82) = auVar94;
        lVar82 = lVar82 + 0x10;
      } while (lVar82 != 0x40);
    }
    else if (cVar2 != '\0') {
      lVar82 = 0;
      do {
        auVar94 = psllw(*(undefined1 (*) [16])((long)local_258 + lVar82),ZEXT416((uint)(int)cVar2));
        *(undefined1 (*) [16])((long)local_258 + lVar82) = auVar94;
        lVar82 = lVar82 + 0x10;
      } while (lVar82 != 0x40);
    }
    pauVar85 = (undefined1 (*) [16])((long)local_258 + (ulong)(((byte)~bVar86 & 1) * 0x30));
    lVar82 = 4;
    do {
      uVar1 = *(ulong *)output;
      auVar14._8_6_ = 0;
      auVar14._0_8_ = uVar1;
      auVar14[0xe] = (char)(uVar1 >> 0x38);
      auVar17._8_4_ = 0;
      auVar17._0_8_ = uVar1;
      auVar17[0xc] = (char)(uVar1 >> 0x30);
      auVar17._13_2_ = auVar14._13_2_;
      auVar20._8_4_ = 0;
      auVar20._0_8_ = uVar1;
      auVar20._12_3_ = auVar17._12_3_;
      auVar23._8_2_ = 0;
      auVar23._0_8_ = uVar1;
      auVar23[10] = (char)(uVar1 >> 0x28);
      auVar23._11_4_ = auVar20._11_4_;
      auVar26._8_2_ = 0;
      auVar26._0_8_ = uVar1;
      auVar26._10_5_ = auVar23._10_5_;
      auVar29[8] = (char)(uVar1 >> 0x20);
      auVar29._0_8_ = uVar1;
      auVar29._9_6_ = auVar26._9_6_;
      auVar50._7_8_ = 0;
      auVar50._0_7_ = auVar29._8_7_;
      auVar69._1_8_ = SUB158(auVar50 << 0x40,7);
      auVar69[0] = (char)(uVar1 >> 0x18);
      auVar69._9_6_ = 0;
      auVar70._1_10_ = SUB1510(auVar69 << 0x30,5);
      auVar70[0] = (char)(uVar1 >> 0x10);
      auVar70._11_4_ = 0;
      auVar32[2] = (char)(uVar1 >> 8);
      auVar32._0_2_ = (ushort)uVar1;
      auVar32._3_12_ = SUB1512(auVar70 << 0x20,3);
      auVar159._0_2_ = (ushort)uVar1 & 0xff;
      auVar159._2_13_ = auVar32._2_13_;
      auVar159[0xf] = 0;
      auVar94 = paddsw(auVar159,*pauVar85);
      sVar5 = auVar94._0_2_;
      sVar6 = auVar94._2_2_;
      sVar7 = auVar94._4_2_;
      sVar8 = auVar94._6_2_;
      sVar9 = auVar94._8_2_;
      sVar10 = auVar94._10_2_;
      sVar11 = auVar94._12_2_;
      sVar12 = auVar94._14_2_;
      *(ulong *)output =
           CONCAT17((0 < sVar12) * (sVar12 < 0x100) * auVar94[0xe] - (0xff < sVar12),
                    CONCAT16((0 < sVar11) * (sVar11 < 0x100) * auVar94[0xc] - (0xff < sVar11),
                             CONCAT15((0 < sVar10) * (sVar10 < 0x100) * auVar94[10] -
                                      (0xff < sVar10),
                                      CONCAT14((0 < sVar9) * (sVar9 < 0x100) * auVar94[8] -
                                               (0xff < sVar9),
                                               CONCAT13((0 < sVar8) * (sVar8 < 0x100) * auVar94[6] -
                                                        (0xff < sVar8),
                                                        CONCAT12((0 < sVar7) * (sVar7 < 0x100) *
                                                                 auVar94[4] - (0xff < sVar7),
                                                                 CONCAT11((0 < sVar6) *
                                                                          (sVar6 < 0x100) *
                                                                          auVar94[2] -
                                                                          (0xff < sVar6),
                                                                          (0 < sVar5) *
                                                                          (sVar5 < 0x100) *
                                                                          auVar94[0] -
                                                                          (0xff < sVar5))))))));
      output = (uint8_t *)((long)output + (long)stride);
      pauVar85 = (undefined1 (*) [16])(pauVar85[-1] + ((bVar86 & 1) << 5));
      lVar82 = lVar82 + -1;
    } while (lVar82 != 0);
    break;
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
code_r0x003d4faf:
    switch(tx_type) {
    default:
      lowbd_inv_txfm2d_add_no_identity_ssse3(input,output,stride,tx_type,tx_size,eob);
      return;
    case '\t':
      av1_lowbd_inv_txfm2d_add_idtx_ssse3(input,output,stride,tx_size);
      return;
    case '\n':
    case '\f':
    case '\x0e':
      av1_lowbd_inv_txfm2d_add_h_identity_ssse3(input,output,stride,tx_type,tx_size,eob);
      return;
    case '\v':
    case '\r':
    case '\x0f':
      av1_lowbd_inv_txfm2d_add_v_identity_ssse3(input,output,stride,tx_type,tx_size,eob);
      return;
    }
  case 0xd:
    local_148 = av1_inv_txfm_shift_ls[0xd];
    p_Var3 = lowbd_txfm_all_1d_w8_arr[0][""[tx_type]];
    uVar79 = 0xbeaf >> (tx_type & 0x1f);
    local_140 = lowbd_txfm_all_1d_w4_arr[2][""[tx_type]];
    local_14c = CONCAT31((int3)(uVar79 >> 8),(byte)uVar79 | 0xf < tx_type);
    piVar88 = input + 4;
    plVar84 = local_258;
    lVar82 = 0;
    auVar94 = _DAT_00568a00;
    auVar118 = _DAT_00568a10;
    auVar119 = _DAT_00568a30;
    do {
      lVar81 = lVar82 * 0x80;
      palVar89 = (__m128i *)(local_258 + lVar82 * 0x10);
      lVar80 = 0;
      do {
        auVar98 = packssdw(*(undefined1 (*) [16])(piVar88 + lVar80 + -4),
                           *(undefined1 (*) [16])(piVar88 + lVar80));
        *(undefined1 (*) [16])((long)plVar84 + lVar80) = auVar98;
        lVar80 = lVar80 + 0x10;
      } while (lVar80 != 0x40);
      if (p_Var3 == iidentity4_ssse3) {
        lVar80 = 0;
        do {
          auVar98 = *(undefined1 (*) [16])((long)plVar84 + lVar80);
          auVar146._0_12_ = auVar98._0_12_;
          auVar146._12_2_ = auVar98._6_2_;
          auVar146._14_2_ = auVar94._6_2_;
          auVar145._12_4_ = auVar146._12_4_;
          auVar145._0_10_ = auVar98._0_10_;
          auVar145._10_2_ = auVar94._4_2_;
          auVar144._10_6_ = auVar145._10_6_;
          auVar144._0_8_ = auVar98._0_8_;
          auVar144._8_2_ = auVar98._4_2_;
          auVar143._8_8_ = auVar144._8_8_;
          auVar143._6_2_ = auVar94._2_2_;
          auVar143._4_2_ = auVar98._2_2_;
          auVar143._0_2_ = auVar98._0_2_;
          auVar143._2_2_ = auVar94._0_2_;
          auVar99._2_2_ = auVar118._8_2_;
          auVar99._0_2_ = auVar98._8_2_;
          auVar99._4_2_ = auVar98._10_2_;
          auVar99._6_2_ = auVar118._10_2_;
          auVar99._8_2_ = auVar98._12_2_;
          auVar99._10_2_ = auVar118._12_2_;
          auVar99._12_2_ = auVar98._14_2_;
          auVar99._14_2_ = auVar118._14_2_;
          auVar98 = pmaddwd(auVar143,auVar119);
          auVar147._0_4_ = auVar98._0_4_ >> 0xd;
          auVar147._4_4_ = auVar98._4_4_ >> 0xd;
          auVar147._8_4_ = auVar98._8_4_ >> 0xd;
          auVar147._12_4_ = auVar98._12_4_ >> 0xd;
          auVar98 = pmaddwd(auVar99,auVar119);
          auVar100._0_4_ = auVar98._0_4_ >> 0xd;
          auVar100._4_4_ = auVar98._4_4_ >> 0xd;
          auVar100._8_4_ = auVar98._8_4_ >> 0xd;
          auVar100._12_4_ = auVar98._12_4_ >> 0xd;
          auVar98 = packssdw(auVar147,auVar100);
          *(undefined1 (*) [16])((long)plVar84 + lVar80) = auVar98;
          lVar80 = lVar80 + 0x10;
        } while (lVar80 != 0x40);
      }
      else {
        (*p_Var3)(palVar89,palVar89);
        cVar2 = *local_148;
        auVar94 = _DAT_00568a00;
        auVar118 = _DAT_00568a10;
        auVar119 = _DAT_00568a30;
        if (cVar2 < 0) {
          auVar98 = ZEXT416((uint)(1 << (cVar2 + 0xfU & 0x1f)));
          auVar98 = pshuflw(auVar98,auVar98,0);
          auVar101._0_4_ = auVar98._0_4_;
          auVar101._4_4_ = auVar101._0_4_;
          auVar101._8_4_ = auVar101._0_4_;
          auVar101._12_4_ = auVar101._0_4_;
          lVar80 = 0;
          do {
            auVar98 = pmulhrsw(*(undefined1 (*) [16])((long)plVar84 + lVar80),auVar101);
            *(undefined1 (*) [16])((long)plVar84 + lVar80) = auVar98;
            lVar80 = lVar80 + 0x10;
          } while (lVar80 != 0x80);
        }
        else if (cVar2 != '\0') {
          lVar80 = 0;
          do {
            auVar98 = psllw(*(undefined1 (*) [16])((long)plVar84 + lVar80),ZEXT416((uint)(int)cVar2)
                           );
            *(undefined1 (*) [16])((long)plVar84 + lVar80) = auVar98;
            lVar80 = lVar80 + 0x10;
          } while (lVar80 != 0x80);
        }
      }
      if ((0x7f1fU >> (tx_type & 0x1f) & 1) == 0 && 0xf >= tx_type) {
        lVar80 = 0x40;
        plVar83 = plVar84;
        do {
          lVar35 = plVar83[1];
          *(longlong *)((long)&local_148 + lVar80) = *plVar83;
          *(longlong *)((long)local_138 + lVar80 + -8) = lVar35;
          plVar83 = plVar83 + 2;
          lVar80 = lVar80 + -0x10;
          alVar102 = local_138;
          auVar98 = local_118;
          uVar138 = local_128;
          uVar180 = uStack_126;
          uVar181 = uStack_124;
          uVar182 = uStack_122;
          uVar183 = uStack_120;
          uVar184 = uStack_11e;
          uVar185 = uStack_11c;
          uVar186 = uStack_11a;
          uVar215 = local_108;
          uVar239 = uStack_106;
          uVar240 = uStack_104;
          uVar241 = uStack_102;
          uVar242 = uStack_100;
          uVar243 = uStack_fe;
          uVar244 = uStack_fc;
          uVar245 = uStack_fa;
        } while (lVar80 != 0);
      }
      else {
        alVar102 = *palVar89;
        auVar98 = *(undefined1 (*) [16])(local_238 + lVar81);
        uVar138 = *(undefined2 *)(&local_248 + lVar82 * 0x10);
        uVar180 = *(undefined2 *)((long)&local_248 + lVar81 + 2);
        uVar181 = *(undefined2 *)((long)&local_248 + lVar81 + 4);
        uVar182 = *(undefined2 *)((long)&local_248 + lVar81 + 6);
        uVar183 = *(undefined2 *)(local_238 + lVar81 + -8);
        uVar184 = *(undefined2 *)(local_238 + lVar81 + -6);
        uVar185 = *(undefined2 *)(local_238 + lVar81 + -4);
        uVar186 = *(undefined2 *)(local_238 + lVar81 + -2);
        uVar215 = *(undefined2 *)(local_228 + lVar81);
        uVar239 = *(undefined2 *)(local_228 + lVar81 + 2);
        uVar240 = *(undefined2 *)(local_228 + lVar81 + 4);
        uVar241 = *(undefined2 *)(local_228 + lVar81 + 6);
        uVar242 = *(undefined2 *)(local_228 + lVar81 + 8);
        uVar243 = *(undefined2 *)(local_228 + lVar81 + 10);
        uVar244 = *(undefined2 *)(local_228 + lVar81 + 0xc);
        uVar245 = *(undefined2 *)(local_228 + lVar81 + 0xe);
      }
      auVar249._0_12_ = alVar102._0_12_;
      auVar249._12_2_ = alVar102[0]._6_2_;
      auVar249._14_2_ = uVar182;
      auVar248._12_4_ = auVar249._12_4_;
      auVar248._0_10_ = alVar102._0_10_;
      auVar248._10_2_ = uVar181;
      auVar247._10_6_ = auVar248._10_6_;
      auVar247._0_8_ = alVar102[0];
      auVar247._8_2_ = alVar102[0]._4_2_;
      auVar46._4_8_ = auVar247._8_8_;
      auVar46._2_2_ = uVar180;
      auVar46._0_2_ = alVar102[0]._2_2_;
      auVar246._0_4_ = CONCAT22(uVar138,(short)alVar102[0]);
      auVar246._4_12_ = auVar46;
      auVar269._0_12_ = auVar98._0_12_;
      auVar269._12_2_ = auVar98._6_2_;
      auVar269._14_2_ = uVar241;
      auVar268._12_4_ = auVar269._12_4_;
      auVar268._0_10_ = auVar98._0_10_;
      auVar268._10_2_ = uVar240;
      auVar267._10_6_ = auVar268._10_6_;
      auVar267._0_8_ = auVar98._0_8_;
      auVar267._8_2_ = auVar98._4_2_;
      auVar47._4_8_ = auVar267._8_8_;
      auVar47._2_2_ = uVar239;
      auVar47._0_2_ = auVar98._2_2_;
      uVar91 = CONCAT22(uVar183,(short)alVar102[1]);
      auVar92._0_8_ = CONCAT26(uVar184,CONCAT24(alVar102[1]._2_2_,uVar91));
      auVar92._8_2_ = alVar102[1]._4_2_;
      auVar92._10_2_ = uVar185;
      auVar103._12_2_ = alVar102[1]._6_2_;
      auVar103._0_12_ = auVar92;
      auVar103._14_2_ = uVar186;
      uVar187 = CONCAT22(uVar242,auVar98._8_2_);
      auVar188._0_8_ = CONCAT26(uVar243,CONCAT24(auVar98._10_2_,uVar187));
      auVar188._8_2_ = auVar98._12_2_;
      auVar188._10_2_ = uVar244;
      auVar190._12_2_ = auVar98._14_2_;
      auVar190._0_12_ = auVar188;
      auVar190._14_2_ = uVar245;
      auVar148._0_8_ = auVar246._0_8_;
      auVar148._8_4_ = auVar46._0_4_;
      auVar148._12_4_ = auVar47._0_4_;
      auVar216._8_4_ = (int)((ulong)auVar92._0_8_ >> 0x20);
      auVar216._0_8_ = auVar92._0_8_;
      auVar216._12_4_ = (int)((ulong)auVar188._0_8_ >> 0x20);
      auVar250._0_8_ = CONCAT44(auVar267._8_4_,auVar247._8_4_);
      auVar250._8_4_ = auVar248._12_4_;
      auVar250._12_4_ = auVar268._12_4_;
      auVar104._0_8_ = CONCAT44(auVar188._8_4_,auVar92._8_4_);
      auVar104._8_4_ = auVar103._12_4_;
      auVar104._12_4_ = auVar190._12_4_;
      (*palVar89)[0] = CONCAT44(CONCAT22(uVar215,auVar98._0_2_),auVar246._0_4_);
      local_258[lVar82 * 0x10 + 1] = 0;
      (&local_248)[lVar82 * 0x10] = auVar148._8_8_;
      *(undefined8 *)(local_238 + lVar81 + -8) = 0;
      *(undefined8 *)(local_238 + lVar81) = auVar250._0_8_;
      *(undefined8 *)(&uStack_230 + lVar82 * 0x20) = 0;
      *(undefined1 (*) [16])(local_228 + lVar81) = auVar250 >> 0x40;
      *(ulong *)(&local_218 + lVar82 * 0x20) = CONCAT44(uVar187,uVar91);
      (&uStack_210)[lVar82 * 0x10] = 0;
      (&local_208)[lVar82 * 0x10] = auVar216._8_8_;
      auStack_200[lVar82 * 0x10] = 0;
      auStack_200[lVar82 * 0x10 + 1] = auVar104._0_8_;
      *(undefined8 *)(local_1e8 + lVar81 + -8) = 0;
      *(undefined1 (*) [16])(local_1e8 + lVar81) = auVar104 >> 0x40;
      plVar84 = plVar84 + 0x10;
      piVar88 = piVar88 + 8;
      bVar90 = lVar82 == 0;
      lVar82 = lVar82 + 1;
    } while (bVar90);
    (*local_140)(&local_258,&local_258);
    cVar2 = local_148[1];
    if (cVar2 < '\0') {
      auVar94 = ZEXT416((uint)(1 << (cVar2 + 0xfU & 0x1f)));
      auVar94 = pshuflw(auVar94,auVar94,0);
      auVar115._0_4_ = auVar94._0_4_;
      auVar115._4_4_ = auVar115._0_4_;
      auVar115._8_4_ = auVar115._0_4_;
      auVar115._12_4_ = auVar115._0_4_;
      lVar82 = 0;
      do {
        auVar94 = pmulhrsw(*(undefined1 (*) [16])((long)local_258 + lVar82),auVar115);
        *(undefined1 (*) [16])((long)local_258 + lVar82) = auVar94;
        lVar82 = lVar82 + 0x10;
      } while (lVar82 != 0x100);
    }
    else if (cVar2 != '\0') {
      lVar82 = 0;
      do {
        auVar94 = psllw(*(undefined1 (*) [16])((long)local_258 + lVar82),ZEXT416((uint)(int)cVar2));
        *(undefined1 (*) [16])((long)local_258 + lVar82) = auVar94;
        lVar82 = lVar82 + 0x10;
      } while (lVar82 != 0x100);
    }
    lVar82 = 0xf0;
    if ((local_14c & 1) != 0) {
      lVar82 = 0;
    }
    pauVar85 = (undefined1 (*) [16])((long)local_258 + lVar82);
    lVar82 = 0x10;
    do {
      uVar91 = *(undefined4 *)output;
      auVar157._8_8_ = 0;
      auVar157._0_8_ =
           (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((
                                                  uint)uVar91 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)uVar91 >> 0x10),uVar91)) >>
                                                  0x20),uVar91) >> 0x18),
                                           CONCAT12((char)((uint)uVar91 >> 8),(short)uVar91)) >>
                                 0x10),(short)uVar91) & 0xffff00ff00ff00ff;
      auVar94 = paddsw(auVar157,*pauVar85);
      sVar5 = auVar94._0_2_;
      sVar6 = auVar94._2_2_;
      sVar7 = auVar94._4_2_;
      sVar8 = auVar94._6_2_;
      *(uint *)output =
           CONCAT13((0 < sVar8) * (sVar8 < 0x100) * auVar94[6] - (0xff < sVar8),
                    CONCAT12((0 < sVar7) * (sVar7 < 0x100) * auVar94[4] - (0xff < sVar7),
                             CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar94[2] - (0xff < sVar6),
                                      (0 < sVar5) * (sVar5 < 0x100) * auVar94[0] - (0xff < sVar5))))
      ;
      output = output + stride;
      pauVar85 = (undefined1 (*) [16])(pauVar85[-1] + ((local_14c & 1) << 5));
      lVar82 = lVar82 + -1;
    } while (lVar82 != 0);
    break;
  case 0xe:
    p_Var3 = lowbd_txfm_all_1d_w4_arr[2][""[tx_type]];
    p_Var4 = lowbd_txfm_all_1d_w8_arr[0][""[tx_type]];
    lVar82 = 0;
    do {
      auVar94 = packssdw(*(undefined1 (*) [16])((long)input + lVar82),
                         *(undefined1 (*) [16])((long)input + lVar82));
      *(undefined1 (*) [16])((long)local_258 + lVar82) = auVar94;
      lVar82 = lVar82 + 0x10;
    } while (lVar82 != 0x100);
    if (p_Var3 == iidentity16_ssse3) {
      lVar82 = 0;
      do {
        auVar94 = *(undefined1 (*) [16])((long)local_258 + lVar82);
        auVar261._0_12_ = auVar94._0_12_;
        auVar261._12_2_ = auVar94._6_2_;
        auVar261._14_2_ = 1;
        auVar260._12_4_ = auVar261._12_4_;
        auVar260._0_10_ = auVar94._0_10_;
        auVar260._10_2_ = 1;
        auVar259._10_6_ = auVar260._10_6_;
        auVar259._0_8_ = auVar94._0_8_;
        auVar259._8_2_ = auVar94._4_2_;
        auVar258._8_8_ = auVar259._8_8_;
        auVar258._0_8_ = 0x1000000000000;
        auVar257._6_10_ = auVar258._6_10_;
        auVar257._4_2_ = auVar94._2_2_;
        auVar257._0_2_ = auVar94._0_2_;
        auVar257._2_2_ = 1;
        auVar225._2_2_ = 0;
        auVar225._0_2_ = auVar94._8_2_;
        auVar225._4_2_ = auVar94._10_2_;
        auVar225._6_2_ = 0;
        auVar225._8_2_ = auVar94._12_2_;
        auVar225._10_2_ = 0;
        auVar225._12_2_ = auVar94._14_2_;
        auVar225._14_2_ = 1;
        auVar94 = pmaddwd(auVar257,_DAT_00568a20);
        auVar262._0_4_ = auVar94._0_4_ >> 0xd;
        auVar262._4_4_ = auVar94._4_4_ >> 0xd;
        auVar262._8_4_ = auVar94._8_4_ >> 0xd;
        auVar262._12_4_ = auVar94._12_4_ >> 0xd;
        auVar94 = pmaddwd(auVar225,_DAT_00568a20);
        auVar226._0_4_ = auVar94._0_4_ >> 0xd;
        auVar226._4_4_ = auVar94._4_4_ >> 0xd;
        auVar226._8_4_ = auVar94._8_4_ >> 0xd;
        auVar226._12_4_ = auVar94._12_4_ >> 0xd;
        auVar94 = packssdw(auVar262,auVar226);
        *(undefined1 (*) [16])((long)local_258 + lVar82) = auVar94;
        lVar82 = lVar82 + 0x10;
      } while (lVar82 != 0x100);
    }
    else {
      (*p_Var3)(&local_258,&local_258);
      cVar2 = *piVar78;
      if (cVar2 < 0) {
        auVar94 = ZEXT416((uint)(1 << (cVar2 + 0xfU & 0x1f)));
        auVar94 = pshuflw(auVar94,auVar94,0);
        auVar121._0_4_ = auVar94._0_4_;
        auVar121._4_4_ = auVar121._0_4_;
        auVar121._8_4_ = auVar121._0_4_;
        auVar121._12_4_ = auVar121._0_4_;
        lVar82 = 0;
        do {
          auVar94 = pmulhrsw(*(undefined1 (*) [16])((long)local_258 + lVar82),auVar121);
          *(undefined1 (*) [16])((long)local_258 + lVar82) = auVar94;
          lVar82 = lVar82 + 0x10;
        } while (lVar82 != 0x100);
      }
      else if (cVar2 != '\0') {
        lVar82 = 0;
        do {
          auVar94 = psllw(*(undefined1 (*) [16])((long)local_258 + lVar82),ZEXT416((uint)(int)cVar2)
                         );
          *(undefined1 (*) [16])((long)local_258 + lVar82) = auVar94;
          lVar82 = lVar82 + 0x10;
        } while (lVar82 != 0x100);
      }
    }
    if ((0x7f1fU >> (tx_type & 0x1f) & 1) == 0 && 0xf >= tx_type) {
      lVar82 = 0x100;
      plVar84 = local_258;
      do {
        lVar35 = plVar84[1];
        *(longlong *)((long)&local_148 + lVar82) = *plVar84;
        *(longlong *)((long)local_138 + lVar82 + -8) = lVar35;
        plVar84 = plVar84 + 2;
        lVar82 = lVar82 + -0x10;
      } while (lVar82 != 0);
      auVar133._0_12_ = local_138._0_12_;
      auVar133._12_2_ = local_138[0]._6_2_;
      auVar133._14_2_ = uStack_122;
      auVar132._12_4_ = auVar133._12_4_;
      auVar132._0_10_ = local_138._0_10_;
      auVar132._10_2_ = uStack_124;
      auVar131._10_6_ = auVar132._10_6_;
      auVar131._0_8_ = local_138[0];
      auVar131._8_2_ = local_138[0]._4_2_;
      auVar59._4_8_ = auVar131._8_8_;
      auVar59._2_2_ = uStack_126;
      auVar59._0_2_ = local_138[0]._2_2_;
      auVar130._0_4_ = CONCAT22(local_128,(short)local_138[0]);
      auVar130._4_12_ = auVar59;
      auVar210._0_12_ = local_118._0_12_;
      auVar210._12_2_ = local_118._6_2_;
      auVar210._14_2_ = uStack_102;
      auVar209._12_4_ = auVar210._12_4_;
      auVar209._0_10_ = local_118._0_10_;
      auVar209._10_2_ = uStack_104;
      auVar208._10_6_ = auVar209._10_6_;
      auVar208._0_8_ = local_118._0_8_;
      auVar208._8_2_ = local_118._4_2_;
      auVar60._4_8_ = auVar208._8_8_;
      auVar60._2_2_ = uStack_106;
      auVar60._0_2_ = local_118._2_2_;
      auVar173._0_12_ = local_f8._0_12_;
      auVar173._12_2_ = local_f8._6_2_;
      auVar173._14_2_ = uStack_e2;
      auVar172._12_4_ = auVar173._12_4_;
      auVar172._0_10_ = local_f8._0_10_;
      auVar172._10_2_ = uStack_e4;
      auVar171._10_6_ = auVar172._10_6_;
      auVar171._0_8_ = local_f8._0_8_;
      auVar171._8_2_ = local_f8._4_2_;
      auVar61._4_8_ = auVar171._8_8_;
      auVar61._2_2_ = uStack_e6;
      auVar61._0_2_ = local_f8._2_2_;
      auVar170._0_4_ = CONCAT22(local_e8,local_f8._0_2_);
      auVar170._4_12_ = auVar61;
      auVar235._0_12_ = local_d8._0_12_;
      auVar235._12_2_ = local_d8._6_2_;
      auVar235._14_2_ = uStack_c2;
      auVar234._12_4_ = auVar235._12_4_;
      auVar234._0_10_ = local_d8._0_10_;
      auVar234._10_2_ = uStack_c4;
      auVar233._10_6_ = auVar234._10_6_;
      auVar233._0_8_ = local_d8._0_8_;
      auVar233._8_2_ = local_d8._4_2_;
      auVar62._4_8_ = auVar233._8_8_;
      auVar62._2_2_ = uStack_c6;
      auVar62._0_2_ = local_d8._2_2_;
      auVar265._0_8_ = auVar130._0_8_;
      auVar265._8_4_ = auVar59._0_4_;
      auVar265._12_4_ = auVar60._0_4_;
      local_248 = auVar265._8_8_;
      local_258[0] = CONCAT44(CONCAT22(local_108,local_118._0_2_),auVar130._0_4_);
      auVar276._0_8_ = auVar170._0_8_;
      auVar276._8_4_ = auVar61._0_4_;
      auVar276._12_4_ = auVar62._0_4_;
      uStack_240 = auVar276._8_8_;
      local_258[1] = CONCAT44(CONCAT22(local_c8,local_d8._0_2_),auVar170._0_4_);
      auVar214._0_12_ = local_b8._0_12_;
      auVar214._12_2_ = local_b8._6_2_;
      auVar214._14_2_ = uStack_a2;
      auVar213._12_4_ = auVar214._12_4_;
      auVar213._0_10_ = local_b8._0_10_;
      auVar213._10_2_ = uStack_a4;
      auVar212._10_6_ = auVar213._10_6_;
      auVar212._0_8_ = local_b8._0_8_;
      auVar212._8_2_ = local_b8._4_2_;
      auVar63._4_8_ = auVar212._8_8_;
      auVar63._2_2_ = uStack_a6;
      auVar63._0_2_ = local_b8._2_2_;
      auVar211._0_4_ = CONCAT22(local_a8,local_b8._0_2_);
      auVar211._4_12_ = auVar63;
      uStack_234 = auVar208._8_4_;
      local_238 = (undefined1  [4])auVar131._8_4_;
      uStack_230 = auVar171._8_4_;
      uStack_22c = auVar233._8_4_;
      auVar238._0_12_ = local_98._0_12_;
      auVar238._12_2_ = local_98._6_2_;
      auVar238._14_2_ = uStack_82;
      auVar237._12_4_ = auVar238._12_4_;
      auVar237._0_10_ = local_98._0_10_;
      auVar237._10_2_ = uStack_84;
      auVar236._10_6_ = auVar237._10_6_;
      auVar236._0_8_ = local_98._0_8_;
      auVar236._8_2_ = local_98._4_2_;
      auVar64._4_8_ = auVar236._8_8_;
      auVar64._2_2_ = uStack_86;
      auVar64._0_2_ = local_98._2_2_;
      auVar177._0_12_ = local_78._0_12_;
      auVar177._12_2_ = local_78._6_2_;
      auVar177._14_2_ = uStack_62;
      auVar176._12_4_ = auVar177._12_4_;
      auVar176._0_10_ = local_78._0_10_;
      auVar176._10_2_ = uStack_64;
      auVar175._10_6_ = auVar176._10_6_;
      auVar175._0_8_ = local_78._0_8_;
      auVar175._8_2_ = local_78._4_2_;
      auVar65._4_8_ = auVar175._8_8_;
      auVar65._2_2_ = uStack_66;
      auVar65._0_2_ = local_78._2_2_;
      auVar174._0_4_ = CONCAT22(local_68,local_78._0_2_);
      auVar174._4_12_ = auVar65;
      local_228._8_4_ = auVar132._12_4_;
      local_228._12_4_ = auVar209._12_4_;
      auVar136._0_12_ = local_58._0_12_;
      auVar136._12_2_ = local_58._6_2_;
      auVar136._14_2_ = uStack_42;
      auVar135._12_4_ = auVar136._12_4_;
      auVar135._0_10_ = local_58._0_10_;
      auVar135._10_2_ = uStack_44;
      auVar134._10_6_ = auVar135._10_6_;
      auVar134._0_8_ = local_58._0_8_;
      auVar134._8_2_ = local_58._4_2_;
      auVar66._4_8_ = auVar134._8_8_;
      auVar66._2_2_ = uStack_46;
      auVar66._0_2_ = local_58._2_2_;
      auVar266._0_8_ = auVar211._0_8_;
      auVar266._8_4_ = auVar63._0_4_;
      auVar266._12_4_ = auVar64._0_4_;
      local_1c8 = auVar266._8_8_;
      local_1d8 = CONCAT44(CONCAT22(local_88,local_98._0_2_),auVar211._0_4_);
      auVar277._0_8_ = auVar174._0_8_;
      auVar277._8_4_ = auVar65._0_4_;
      auVar277._12_4_ = auVar66._0_4_;
      uStack_1c0 = auVar277._8_8_;
      uStack_1d0 = CONCAT44(CONCAT22(local_48,local_58._0_2_),auVar174._0_4_);
      local_1b8 = auVar212._8_4_;
      uStack_1b4 = auVar236._8_4_;
      uStack_1b0 = auVar175._8_4_;
      uStack_1ac = auVar134._8_4_;
      local_218 = auVar172._12_4_;
      uStack_214 = auVar234._12_4_;
      uStack_1a0 = auVar213._12_4_;
      uStack_19c = auVar237._12_4_;
      local_198 = auVar176._12_4_;
      uStack_194 = auVar135._12_4_;
    }
    else {
      auVar38._8_8_ = local_258[1];
      auVar38._0_8_ = local_258[0];
      auVar40._8_8_ = uStack_210;
      auVar40._0_8_ = CONCAT44(uStack_214,local_218);
      auVar42._8_8_ = auStack_200[2];
      auVar42._0_8_ = auStack_200[1];
      auVar125._0_12_ = auVar38._0_12_;
      auVar125._12_2_ = (short)((ulong)local_258[0] >> 0x30);
      auVar125._14_2_ = local_248._6_2_;
      auVar124._12_4_ = auVar125._12_4_;
      auVar124._0_10_ = auVar38._0_10_;
      auVar124._10_2_ = local_248._4_2_;
      auVar123._10_6_ = auVar124._10_6_;
      auVar123._8_2_ = (short)((ulong)local_258[0] >> 0x20);
      auVar123._0_8_ = local_258[0];
      auVar51._4_8_ = auVar123._8_8_;
      auVar51._2_2_ = local_248._2_2_;
      auVar51._0_2_ = (short)((ulong)local_258[0] >> 0x10);
      auVar122._0_4_ = CONCAT22((undefined2)local_248,(short)local_258[0]);
      auVar122._4_12_ = auVar51;
      auVar166._12_2_ = local_238._6_2_;
      auVar166._0_12_ = _local_238;
      auVar166._14_2_ = local_228._6_2_;
      auVar165._12_4_ = auVar166._12_4_;
      auVar165._0_10_ = local_238._0_10_;
      auVar165._10_2_ = local_228._4_2_;
      auVar164._10_6_ = auVar165._10_6_;
      auVar164._0_8_ = local_238._0_8_;
      auVar164._8_2_ = local_238._4_2_;
      auVar52._4_8_ = auVar164._8_8_;
      auVar52._2_2_ = local_228._2_2_;
      auVar52._0_2_ = local_238._2_2_;
      auVar203._0_12_ = auVar40._0_12_;
      auVar203._12_2_ = (short)((uint)uStack_214 >> 0x10);
      auVar203._14_2_ = local_208._6_2_;
      auVar202._12_4_ = auVar203._12_4_;
      auVar202._0_10_ = auVar40._0_10_;
      auVar202._10_2_ = local_208._4_2_;
      auVar201._10_6_ = auVar202._10_6_;
      auVar201._8_2_ = (short)uStack_214;
      auVar201._0_8_ = CONCAT44(uStack_214,local_218);
      auVar53._4_8_ = auVar201._8_8_;
      auVar53._2_2_ = local_208._2_2_;
      auVar53._0_2_ = (short)((uint)local_218 >> 0x10);
      auVar200._0_4_ = CONCAT22((undefined2)local_208,(short)local_218);
      auVar200._4_12_ = auVar53;
      auVar229._0_12_ = auVar42._0_12_;
      auVar229._12_2_ = (short)((ulong)auStack_200[1] >> 0x30);
      auVar229._14_2_ = local_1e8._6_2_;
      auVar228._12_4_ = auVar229._12_4_;
      auVar228._0_10_ = auVar42._0_10_;
      auVar228._10_2_ = local_1e8._4_2_;
      auVar227._10_6_ = auVar228._10_6_;
      auVar227._8_2_ = (short)((ulong)auStack_200[1] >> 0x20);
      auVar227._0_8_ = auStack_200[1];
      auVar54._4_8_ = auVar227._8_8_;
      auVar54._2_2_ = local_1e8._2_2_;
      auVar54._0_2_ = (short)((ulong)auStack_200[1] >> 0x10);
      auVar263._0_8_ = auVar122._0_8_;
      auVar263._8_4_ = auVar51._0_4_;
      auVar263._12_4_ = auVar52._0_4_;
      local_248 = auVar263._8_8_;
      local_258[0] = CONCAT44(CONCAT22(local_228._0_2_,local_238._0_2_),auVar122._0_4_);
      auVar274._0_8_ = auVar200._0_8_;
      auVar274._8_4_ = auVar53._0_4_;
      auVar274._12_4_ = auVar54._0_4_;
      uStack_240 = auVar274._8_8_;
      local_258[1] = CONCAT44(CONCAT22(local_1e8._0_2_,(short)auStack_200[1]),auVar200._0_4_);
      uStack_234 = auVar164._8_4_;
      local_238 = (undefined1  [4])auVar123._8_4_;
      uStack_230 = auVar201._8_4_;
      uStack_22c = auVar227._8_4_;
      local_228._8_4_ = auVar124._12_4_;
      local_228._12_4_ = auVar165._12_4_;
      auVar43._8_8_ = uStack_1d0;
      auVar43._0_8_ = local_1d8;
      auVar129._0_12_ = auVar43._0_12_;
      auVar129._12_2_ = (short)((ulong)local_1d8 >> 0x30);
      auVar129._14_2_ = local_1c8._6_2_;
      auVar128._12_4_ = auVar129._12_4_;
      auVar128._0_10_ = auVar43._0_10_;
      auVar128._10_2_ = local_1c8._4_2_;
      auVar127._10_6_ = auVar128._10_6_;
      auVar127._8_2_ = (short)((ulong)local_1d8 >> 0x20);
      auVar127._0_8_ = local_1d8;
      auVar55._4_8_ = auVar127._8_8_;
      auVar55._2_2_ = local_1c8._2_2_;
      auVar55._0_2_ = (short)((ulong)local_1d8 >> 0x10);
      auVar126._0_4_ = CONCAT22((undefined2)local_1c8,(short)local_1d8);
      auVar126._4_12_ = auVar55;
      auVar44._8_4_ = uStack_1b0;
      auVar44._0_8_ = CONCAT44(uStack_1b4,local_1b8);
      auVar169._12_2_ = (short)((uint)uStack_1b4 >> 0x10);
      auVar169._0_12_ = auVar44;
      auVar169._14_2_ = uStack_1a2;
      auVar168._12_4_ = auVar169._12_4_;
      auVar168._0_10_ = auVar44._0_10_;
      auVar168._10_2_ = uStack_1a4;
      auVar167._10_6_ = auVar168._10_6_;
      auVar167._8_2_ = (short)uStack_1b4;
      auVar167._0_8_ = CONCAT44(uStack_1b4,local_1b8);
      auVar56._4_8_ = auVar167._8_8_;
      auVar56._2_2_ = uStack_1a6;
      auVar56._0_2_ = (short)((uint)local_1b8 >> 0x10);
      auVar45._8_8_ = uStack_190;
      auVar45._0_8_ = CONCAT44(uStack_194,local_198);
      auVar207._0_12_ = auVar45._0_12_;
      auVar207._12_2_ = (short)((uint)uStack_194 >> 0x10);
      auVar207._14_2_ = uStack_182;
      auVar206._12_4_ = auVar207._12_4_;
      auVar206._0_10_ = auVar45._0_10_;
      auVar206._10_2_ = uStack_184;
      auVar205._10_6_ = auVar206._10_6_;
      auVar205._8_2_ = (short)uStack_194;
      auVar205._0_8_ = CONCAT44(uStack_194,local_198);
      auVar57._4_8_ = auVar205._8_8_;
      auVar57._2_2_ = uStack_186;
      auVar57._0_2_ = (short)((uint)local_198 >> 0x10);
      auVar204._0_4_ = CONCAT22(local_188,(short)local_198);
      auVar204._4_12_ = auVar57;
      auVar232._12_2_ = local_178._6_2_;
      auVar232._0_12_ = local_178;
      auVar232._14_2_ = uStack_162;
      auVar231._12_4_ = auVar232._12_4_;
      auVar231._0_10_ = local_178._0_10_;
      auVar231._10_2_ = uStack_164;
      auVar230._10_6_ = auVar231._10_6_;
      auVar230._0_8_ = local_178._0_8_;
      auVar230._8_2_ = local_178._4_2_;
      auVar58._4_8_ = auVar230._8_8_;
      auVar58._2_2_ = uStack_166;
      auVar58._0_2_ = local_178._2_2_;
      auVar264._0_8_ = auVar126._0_8_;
      auVar264._8_4_ = auVar55._0_4_;
      auVar264._12_4_ = auVar56._0_4_;
      local_1c8 = auVar264._8_8_;
      local_1d8 = CONCAT44(CONCAT22(local_1a8,(short)local_1b8),auVar126._0_4_);
      auVar275._0_8_ = auVar204._0_8_;
      auVar275._8_4_ = auVar57._0_4_;
      auVar275._12_4_ = auVar58._0_4_;
      uStack_1c0 = auVar275._8_8_;
      uStack_1d0 = CONCAT44(CONCAT22(local_168,local_178._0_2_),auVar204._0_4_);
      local_1b8 = auVar127._8_4_;
      uStack_1b4 = auVar167._8_4_;
      uStack_1b0 = auVar205._8_4_;
      uStack_1ac = auVar230._8_4_;
      local_218 = auVar202._12_4_;
      uStack_214 = auVar228._12_4_;
      uStack_1a0 = auVar128._12_4_;
      uStack_19c = auVar168._12_4_;
      local_198 = auVar206._12_4_;
      uStack_194 = auVar231._12_4_;
    }
    plVar84 = local_258;
    lVar82 = 0;
    do {
      (*p_Var4)((__m128i *)(local_258 + lVar82 * 0x10),(__m128i *)(local_258 + lVar82 * 0x10));
      cVar2 = piVar78[1];
      if (cVar2 < 0) {
        auVar94 = ZEXT416((uint)(1 << (cVar2 + 0xfU & 0x1f)));
        auVar94 = pshuflw(auVar94,auVar94,0);
        auVar137._0_4_ = auVar94._0_4_;
        auVar137._4_4_ = auVar137._0_4_;
        auVar137._8_4_ = auVar137._0_4_;
        auVar137._12_4_ = auVar137._0_4_;
        lVar81 = 0;
        do {
          auVar94 = pmulhrsw(*(undefined1 (*) [16])((long)plVar84 + lVar81),auVar137);
          *(undefined1 (*) [16])((long)plVar84 + lVar81) = auVar94;
          lVar81 = lVar81 + 0x10;
        } while (lVar81 != 0x40);
      }
      else if (cVar2 != '\0') {
        lVar81 = 0;
        do {
          auVar94 = psllw(*(undefined1 (*) [16])((long)plVar84 + lVar81),ZEXT416((uint)(int)cVar2));
          *(undefined1 (*) [16])((long)plVar84 + lVar81) = auVar94;
          lVar81 = lVar81 + 0x10;
        } while (lVar81 != 0x40);
      }
      plVar84 = plVar84 + 0x10;
      bVar90 = lVar82 == 0;
      lVar82 = lVar82 + 1;
    } while (bVar90);
    uVar79 = (byte)~((byte)(0xbeaf >> (tx_type & 0x1f)) | 0xf < tx_type) & 1;
    pauVar85 = (undefined1 (*) [16])((long)local_258 + (ulong)(uVar79 * 0x30));
    lVar82 = 4;
    puVar87 = (ulong *)output;
    do {
      uVar1 = *puVar87;
      auVar15._8_6_ = 0;
      auVar15._0_8_ = uVar1;
      auVar15[0xe] = (char)(uVar1 >> 0x38);
      auVar18._8_4_ = 0;
      auVar18._0_8_ = uVar1;
      auVar18[0xc] = (char)(uVar1 >> 0x30);
      auVar18._13_2_ = auVar15._13_2_;
      auVar21._8_4_ = 0;
      auVar21._0_8_ = uVar1;
      auVar21._12_3_ = auVar18._12_3_;
      auVar24._8_2_ = 0;
      auVar24._0_8_ = uVar1;
      auVar24[10] = (char)(uVar1 >> 0x28);
      auVar24._11_4_ = auVar21._11_4_;
      auVar27._8_2_ = 0;
      auVar27._0_8_ = uVar1;
      auVar27._10_5_ = auVar24._10_5_;
      auVar30[8] = (char)(uVar1 >> 0x20);
      auVar30._0_8_ = uVar1;
      auVar30._9_6_ = auVar27._9_6_;
      auVar67._7_8_ = 0;
      auVar67._0_7_ = auVar30._8_7_;
      auVar71._1_8_ = SUB158(auVar67 << 0x40,7);
      auVar71[0] = (char)(uVar1 >> 0x18);
      auVar71._9_6_ = 0;
      auVar72._1_10_ = SUB1510(auVar71 << 0x30,5);
      auVar72[0] = (char)(uVar1 >> 0x10);
      auVar72._11_4_ = 0;
      auVar33[2] = (char)(uVar1 >> 8);
      auVar33._0_2_ = (ushort)uVar1;
      auVar33._3_12_ = SUB1512(auVar72 << 0x20,3);
      auVar178._0_2_ = (ushort)uVar1 & 0xff;
      auVar178._2_13_ = auVar33._2_13_;
      auVar178[0xf] = 0;
      auVar94 = paddsw(auVar178,*pauVar85);
      sVar5 = auVar94._0_2_;
      sVar6 = auVar94._2_2_;
      sVar7 = auVar94._4_2_;
      sVar8 = auVar94._6_2_;
      sVar9 = auVar94._8_2_;
      sVar10 = auVar94._10_2_;
      sVar11 = auVar94._12_2_;
      sVar12 = auVar94._14_2_;
      *puVar87 = CONCAT17((0 < sVar12) * (sVar12 < 0x100) * auVar94[0xe] - (0xff < sVar12),
                          CONCAT16((0 < sVar11) * (sVar11 < 0x100) * auVar94[0xc] - (0xff < sVar11),
                                   CONCAT15((0 < sVar10) * (sVar10 < 0x100) * auVar94[10] -
                                            (0xff < sVar10),
                                            CONCAT14((0 < sVar9) * (sVar9 < 0x100) * auVar94[8] -
                                                     (0xff < sVar9),
                                                     CONCAT13((0 < sVar8) * (sVar8 < 0x100) *
                                                              auVar94[6] - (0xff < sVar8),
                                                              CONCAT12((0 < sVar7) * (sVar7 < 0x100)
                                                                       * auVar94[4] - (0xff < sVar7)
                                                                       ,CONCAT11((0 < sVar6) *
                                                                                 (sVar6 < 0x100) *
                                                                                 auVar94[2] -
                                                                                 (0xff < sVar6),
                                                                                 (0 < sVar5) *
                                                                                 (sVar5 < 0x100) *
                                                                                 auVar94[0] -
                                                                                 (0xff < sVar5))))))
                                  ));
      puVar87 = (ulong *)((long)puVar87 + (long)stride);
      pauVar85 = pauVar85 + (-(ulong)uVar79 | 1);
      lVar82 = lVar82 + -1;
    } while (lVar82 != 0);
    puVar87 = (ulong *)(output + 8);
    pauVar85 = (undefined1 (*) [16])((long)&local_1d8 + (ulong)(uVar79 * 0x30));
    lVar82 = 4;
    do {
      uVar1 = *puVar87;
      auVar16._8_6_ = 0;
      auVar16._0_8_ = uVar1;
      auVar16[0xe] = (char)(uVar1 >> 0x38);
      auVar19._8_4_ = 0;
      auVar19._0_8_ = uVar1;
      auVar19[0xc] = (char)(uVar1 >> 0x30);
      auVar19._13_2_ = auVar16._13_2_;
      auVar22._8_4_ = 0;
      auVar22._0_8_ = uVar1;
      auVar22._12_3_ = auVar19._12_3_;
      auVar25._8_2_ = 0;
      auVar25._0_8_ = uVar1;
      auVar25[10] = (char)(uVar1 >> 0x28);
      auVar25._11_4_ = auVar22._11_4_;
      auVar28._8_2_ = 0;
      auVar28._0_8_ = uVar1;
      auVar28._10_5_ = auVar25._10_5_;
      auVar31[8] = (char)(uVar1 >> 0x20);
      auVar31._0_8_ = uVar1;
      auVar31._9_6_ = auVar28._9_6_;
      auVar68._7_8_ = 0;
      auVar68._0_7_ = auVar31._8_7_;
      auVar73._1_8_ = SUB158(auVar68 << 0x40,7);
      auVar73[0] = (char)(uVar1 >> 0x18);
      auVar73._9_6_ = 0;
      auVar74._1_10_ = SUB1510(auVar73 << 0x30,5);
      auVar74[0] = (char)(uVar1 >> 0x10);
      auVar74._11_4_ = 0;
      auVar34[2] = (char)(uVar1 >> 8);
      auVar34._0_2_ = (ushort)uVar1;
      auVar34._3_12_ = SUB1512(auVar74 << 0x20,3);
      auVar179._0_2_ = (ushort)uVar1 & 0xff;
      auVar179._2_13_ = auVar34._2_13_;
      auVar179[0xf] = 0;
      auVar94 = paddsw(auVar179,*pauVar85);
      sVar5 = auVar94._0_2_;
      sVar6 = auVar94._2_2_;
      sVar7 = auVar94._4_2_;
      sVar8 = auVar94._6_2_;
      sVar9 = auVar94._8_2_;
      sVar10 = auVar94._10_2_;
      sVar11 = auVar94._12_2_;
      sVar12 = auVar94._14_2_;
      *puVar87 = CONCAT17((0 < sVar12) * (sVar12 < 0x100) * auVar94[0xe] - (0xff < sVar12),
                          CONCAT16((0 < sVar11) * (sVar11 < 0x100) * auVar94[0xc] - (0xff < sVar11),
                                   CONCAT15((0 < sVar10) * (sVar10 < 0x100) * auVar94[10] -
                                            (0xff < sVar10),
                                            CONCAT14((0 < sVar9) * (sVar9 < 0x100) * auVar94[8] -
                                                     (0xff < sVar9),
                                                     CONCAT13((0 < sVar8) * (sVar8 < 0x100) *
                                                              auVar94[6] - (0xff < sVar8),
                                                              CONCAT12((0 < sVar7) * (sVar7 < 0x100)
                                                                       * auVar94[4] - (0xff < sVar7)
                                                                       ,CONCAT11((0 < sVar6) *
                                                                                 (sVar6 < 0x100) *
                                                                                 auVar94[2] -
                                                                                 (0xff < sVar6),
                                                                                 (0 < sVar5) *
                                                                                 (sVar5 < 0x100) *
                                                                                 auVar94[0] -
                                                                                 (0xff < sVar5))))))
                                  ));
      puVar87 = (ulong *)((long)puVar87 + (long)stride);
      pauVar85 = pauVar85 + (-(ulong)uVar79 | 1);
      lVar82 = lVar82 + -1;
    } while (lVar82 != 0);
    break;
  default:
    if (iVar13 != 0) goto code_r0x003d4faf;
    p_Var3 = lowbd_txfm_all_1d_w4_arr[0][""[tx_type]];
    p_Var4 = lowbd_txfm_all_1d_w4_arr[0][""[tx_type]];
    bVar86 = (byte)(0xbeaf >> (tx_type & 0x1f)) | 0xf < tx_type;
    lVar82 = 0;
    do {
      auVar94 = packssdw(*(undefined1 (*) [16])((long)input + lVar82),
                         *(undefined1 (*) [16])((long)input + lVar82));
      *(undefined1 (*) [16])((long)local_258 + lVar82) = auVar94;
      lVar82 = lVar82 + 0x10;
    } while (lVar82 != 0x40);
    palVar89 = &local_258;
    _local_238 = stack0xfffffffffffffdca;
    (*p_Var3)(palVar89,palVar89);
    if ((0x7f1fU >> (tx_type & 0x1f) & 1) == 0 && 0xf >= tx_type) {
      lVar82 = 0x40;
      do {
        lVar35 = (*palVar89)[1];
        *(longlong *)((long)&local_148 + lVar82) = (*palVar89)[0];
        *(longlong *)((long)local_138 + lVar82 + -8) = lVar35;
        palVar89 = palVar89 + 1;
        lVar82 = lVar82 + -0x10;
      } while (lVar82 != 0);
      auVar119._0_12_ = local_138._0_12_;
      auVar119._12_2_ = local_138[0]._6_2_;
      auVar119._14_2_ = uStack_122;
      auVar118._12_4_ = auVar119._12_4_;
      auVar118._0_10_ = local_138._0_10_;
      auVar118._10_2_ = uStack_124;
      auVar94._10_6_ = auVar118._10_6_;
      auVar94._0_8_ = local_138[0];
      auVar94._8_2_ = local_138[0]._4_2_;
      auVar98._8_8_ = auVar94._8_8_;
      auVar98._6_2_ = uStack_126;
      auVar98._4_2_ = local_138[0]._2_2_;
      auVar98._0_2_ = (undefined2)local_138[0];
      auVar98._2_2_ = local_128;
      auVar162._0_12_ = local_118._0_12_;
      auVar162._12_2_ = local_118._6_2_;
      auVar162._14_2_ = uStack_102;
      auVar161._12_4_ = auVar162._12_4_;
      auVar161._0_10_ = local_118._0_10_;
      auVar161._10_2_ = uStack_104;
      auVar160._10_6_ = auVar161._10_6_;
      auVar160._0_8_ = local_118._0_8_;
      auVar160._8_2_ = local_118._4_2_;
      auVar139._8_8_ = auVar160._8_8_;
      auVar139._6_2_ = uStack_106;
      auVar139._4_2_ = local_118._2_2_;
      auVar139._0_2_ = local_118._0_2_;
      auVar139._2_2_ = local_108;
    }
    else {
      auVar36._8_8_ = local_258[1];
      auVar36._0_8_ = local_258[0];
      auVar97._0_12_ = auVar36._0_12_;
      auVar97._12_2_ = (short)((ulong)local_258[0] >> 0x30);
      auVar97._14_2_ = local_248._6_2_;
      auVar96._12_4_ = auVar97._12_4_;
      auVar96._0_10_ = auVar36._0_10_;
      auVar96._10_2_ = local_248._4_2_;
      auVar95._10_6_ = auVar96._10_6_;
      auVar95._8_2_ = (short)((ulong)local_258[0] >> 0x20);
      auVar95._0_8_ = local_258[0];
      auVar98._8_8_ = auVar95._8_8_;
      auVar98._6_2_ = local_248._2_2_;
      auVar98._4_2_ = (short)((ulong)local_258[0] >> 0x10);
      auVar98._0_2_ = (undefined2)local_258[0];
      auVar98._2_2_ = (undefined2)local_248;
      auVar142._12_2_ = local_238._6_2_;
      auVar142._0_12_ = _local_238;
      auVar142._14_2_ = local_228._6_2_;
      auVar141._12_4_ = auVar142._12_4_;
      auVar141._0_10_ = local_238._0_10_;
      auVar141._10_2_ = local_228._4_2_;
      auVar140._10_6_ = auVar141._10_6_;
      auVar140._0_8_ = local_238._0_8_;
      auVar140._8_2_ = local_238._4_2_;
      auVar139._8_8_ = auVar140._8_8_;
      auVar139._6_2_ = local_228._2_2_;
      auVar139._4_2_ = local_238._2_2_;
      auVar139._0_2_ = local_238._0_2_;
      auVar139._2_2_ = local_228._0_2_;
    }
    auVar199._0_8_ = auVar98._0_8_;
    auVar199._8_4_ = auVar98._4_4_;
    auVar199._12_4_ = auVar139._4_4_;
    local_258[1] = auVar199._8_8_;
    local_258[0] = CONCAT44(auVar139._0_4_,auVar98._0_4_);
    uStack_240 = 0;
    uStack_234 = auVar139._8_4_;
    local_238 = (undefined1  [4])auVar98._8_4_;
    uStack_230 = auVar98._12_4_;
    uStack_22c = auVar139._12_4_;
    local_228 = _local_238 >> 0x40;
    local_248 = local_258[1];
    (*p_Var4)(&local_258,&local_258);
    cVar2 = piVar75[1];
    if (cVar2 < '\0') {
      auVar94 = ZEXT416((uint)(1 << (cVar2 + 0xfU & 0x1f)));
      auVar94 = pshuflw(auVar94,auVar94,0);
      auVar120._0_4_ = auVar94._0_4_;
      auVar120._4_4_ = auVar120._0_4_;
      auVar120._8_4_ = auVar120._0_4_;
      auVar120._12_4_ = auVar120._0_4_;
      lVar82 = 0;
      do {
        auVar94 = pmulhrsw(*(undefined1 (*) [16])((long)local_258 + lVar82),auVar120);
        *(undefined1 (*) [16])((long)local_258 + lVar82) = auVar94;
        lVar82 = lVar82 + 0x10;
      } while (lVar82 != 0x40);
    }
    else if (cVar2 != '\0') {
      lVar82 = 0;
      do {
        auVar94 = psllw(*(undefined1 (*) [16])((long)local_258 + lVar82),ZEXT416((uint)(int)cVar2));
        *(undefined1 (*) [16])((long)local_258 + lVar82) = auVar94;
        lVar82 = lVar82 + 0x10;
      } while (lVar82 != 0x40);
    }
    pauVar85 = (undefined1 (*) [16])((long)local_258 + (ulong)(((byte)~bVar86 & 1) * 0x30));
    lVar82 = 4;
    do {
      uVar91 = *(undefined4 *)output;
      auVar163._8_8_ = 0;
      auVar163._0_8_ =
           (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((
                                                  uint)uVar91 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)uVar91 >> 0x10),uVar91)) >>
                                                  0x20),uVar91) >> 0x18),
                                           CONCAT12((char)((uint)uVar91 >> 8),(short)uVar91)) >>
                                 0x10),(short)uVar91) & 0xffff00ff00ff00ff;
      auVar94 = paddsw(auVar163,*pauVar85);
      sVar5 = auVar94._0_2_;
      sVar6 = auVar94._2_2_;
      sVar7 = auVar94._4_2_;
      sVar8 = auVar94._6_2_;
      *(uint *)output =
           CONCAT13((0 < sVar8) * (sVar8 < 0x100) * auVar94[6] - (0xff < sVar8),
                    CONCAT12((0 < sVar7) * (sVar7 < 0x100) * auVar94[4] - (0xff < sVar7),
                             CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar94[2] - (0xff < sVar6),
                                      (0 < sVar5) * (sVar5 < 0x100) * auVar94[0] - (0xff < sVar5))))
      ;
      output = output + stride;
      pauVar85 = (undefined1 (*) [16])(pauVar85[-1] + ((bVar86 & 1) << 5));
      lVar82 = lVar82 + -1;
    } while (lVar82 != 0);
  }
  return;
}

Assistant:

void av1_lowbd_inv_txfm2d_add_ssse3(const int32_t *input, uint8_t *output,
                                    int stride, TX_TYPE tx_type,
                                    TX_SIZE tx_size, int eob) {
  switch (tx_size) {
    case TX_4X4:
      lowbd_inv_txfm2d_add_4x4_ssse3(input, output, stride, tx_type, tx_size,
                                     eob);
      break;
    case TX_4X8:
      lowbd_inv_txfm2d_add_4x8_ssse3(input, output, stride, tx_type, tx_size,
                                     eob);
      break;
    case TX_8X4:
      lowbd_inv_txfm2d_add_8x4_ssse3(input, output, stride, tx_type, tx_size,
                                     eob);
      break;
    case TX_4X16:
      lowbd_inv_txfm2d_add_4x16_ssse3(input, output, stride, tx_type, tx_size,
                                      eob);
      break;
    case TX_16X4:
      lowbd_inv_txfm2d_add_16x4_ssse3(input, output, stride, tx_type, tx_size,
                                      eob);
      break;
    default:
      lowbd_inv_txfm2d_add_universe_ssse3(input, output, stride, tx_type,
                                          tx_size, eob);
      break;
  }
}